

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O3

int xmlSchemaComparePreserveReplaceStrings(xmlChar *x,xmlChar *y,int invert)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  
  bVar2 = *x;
  if (bVar2 != 0) {
    pbVar3 = x + 1;
    do {
      bVar1 = *y;
      if ((1 < bVar1 - 9) && (bVar1 != 0xd)) {
        if (bVar1 != 0) {
          if (bVar2 < bVar1) goto LAB_001b292f;
          if (bVar2 == bVar1) goto LAB_001b291e;
        }
LAB_001b293b:
        bVar4 = invert != 0;
        goto LAB_001b293f;
      }
      if (bVar2 != 0x20) {
        if (0x1f < bVar2) goto LAB_001b293b;
        goto LAB_001b292f;
      }
LAB_001b291e:
      y = y + 1;
      bVar2 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while (bVar2 != 0);
  }
  if (*y == 0) {
    return 0;
  }
LAB_001b292f:
  bVar4 = invert == 0;
LAB_001b293f:
  return -(uint)bVar4 | 1;
}

Assistant:

static int
xmlSchemaComparePreserveReplaceStrings(const xmlChar *x,
				       const xmlChar *y,
				       int invert)
{
    int tmp;

    while ((*x != 0) && (*y != 0)) {
	if (IS_WSP_REPLACE_CH(*y)) {
	    if (! IS_WSP_SPACE_CH(*x)) {
		if ((*x - 0x20) < 0) {
		    if (invert)
			return(1);
		    else
			return(-1);
		} else {
		    if (invert)
			return(-1);
		    else
			return(1);
		}
	    }
	} else {
	    tmp = *x - *y;
	    if (tmp < 0) {
		if (invert)
		    return(1);
		else
		    return(-1);
	    }
	    if (tmp > 0) {
		if (invert)
		    return(-1);
		else
		    return(1);
	    }
	}
	x++;
	y++;
    }
    if (*x != 0) {
	if (invert)
	    return(-1);
	else
	    return(1);
    }
    if (*y != 0) {
	if (invert)
	    return(1);
	else
	    return(-1);
    }
    return(0);
}